

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O3

void UConverter_toUnicode_ISO_2022_CN_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  char cVar1;
  byte bVar2;
  byte *sourceLimit;
  void *pvVar3;
  UChar *pUVar4;
  int32_t *piVar5;
  UChar *pUVar6;
  uint uVar7;
  UChar UVar8;
  uint uVar9;
  long lVar10;
  int8_t iVar11;
  int32_t length;
  int iVar12;
  UConverter *pUVar13;
  UConverterSharedData *sharedData;
  UChar *pUVar14;
  uint uVar15;
  byte *pbVar16;
  byte *pbVar17;
  byte *local_58;
  UErrorCode *local_50;
  char local_43;
  undefined1 local_42;
  byte local_41;
  ulong local_40;
  undefined4 *local_38;
  
  pbVar17 = (byte *)args->source;
  pUVar14 = args->target;
  pUVar13 = args->converter;
  sourceLimit = (byte *)args->sourceLimit;
  pvVar3 = pUVar13->extraInfo;
  local_38 = (undefined4 *)((long)pvVar3 + 0x5c);
  if (*(int *)((long)pvVar3 + 0x68) == 0) {
    local_58 = pbVar17;
    local_50 = err;
    if (sourceLimit <= pbVar17 || pUVar13->toULength != '\x01') goto LAB_0030b944;
    local_50 = err;
    if (args->targetLimit <= pUVar14) goto LAB_0030b944;
    pUVar13->toULength = '\0';
    uVar15 = (uint)pUVar13->toUBytes[0];
    local_50 = err;
    goto LAB_0030ba40;
  }
LAB_0030b865:
  local_40 = CONCAT71(local_40._1_7_,pUVar13->toULength);
  local_58 = pbVar17;
  changeState_2022(pUVar13,(char **)&local_58,(char *)sourceLimit,ISO_2022_CN,err);
  if (*(int *)((long)pvVar3 + 0x68) == 0) {
    if (U_ZERO_ERROR < *err) goto LAB_0030b90c;
    if (*(char *)((long)pvVar3 + 0x70) != '\0') {
      *err = U_ILLEGAL_ESCAPE_SEQUENCE;
      pUVar13 = args->converter;
      pUVar13->toUCallbackReason = UCNV_IRREGULAR;
      pUVar13->toULength = (char)local_40 + ((char)local_58 - (char)pbVar17);
      goto LAB_0030b90c;
    }
  }
  local_50 = err;
  if (*err < U_ILLEGAL_ARGUMENT_ERROR) {
LAB_0030b944:
    pbVar17 = local_58;
    if (local_58 < sourceLimit) {
      pUVar4 = args->targetLimit;
      lVar10 = (long)sourceLimit - (long)local_58;
      pbVar16 = local_58;
      do {
        if (pUVar4 <= pUVar14) {
          *local_50 = U_BUFFER_OVERFLOW_ERROR;
          pbVar17 = local_58;
          break;
        }
        bVar2 = *pbVar16;
        uVar9 = (uint)bVar2;
        uVar15 = uVar9;
        switch(bVar2) {
        case 10:
        case 0xd:
          goto switchD_0030b981_caseD_a;
        case 0xe:
          if (*(char *)((long)pvVar3 + 0x5d) != '\0') {
            *(undefined1 *)((long)pvVar3 + 0x60) = 1;
            *(undefined1 *)((long)pvVar3 + 0x70) = 1;
            goto LAB_0030b9a9;
          }
          *(undefined1 *)((long)pvVar3 + 0x70) = 0;
          uVar15 = 0xe;
          uVar7 = 0xffff;
          goto LAB_0030bb64;
        case 0xf:
          *(undefined1 *)((long)pvVar3 + 0x60) = 0;
          if (*(char *)((long)pvVar3 + 0x70) != '\0') {
            *(undefined1 *)((long)pvVar3 + 0x70) = 0;
            *local_50 = U_ILLEGAL_ESCAPE_SEQUENCE;
            pUVar13 = args->converter;
            pUVar13->toUCallbackReason = UCNV_IRREGULAR;
            pUVar13->toUBytes[0] = '\x0f';
            args->converter->toULength = '\x01';
            args->target = pUVar14;
            args->source = (char *)(pbVar16 + 1);
            return;
          }
LAB_0030b9a9:
          pbVar16 = pbVar16 + 1;
          lVar10 = lVar10 + -1;
          pbVar17 = sourceLimit;
          if (lVar10 == 0) goto LAB_0030b9c1;
          break;
        default:
          if (uVar9 == 0x1b) {
            pUVar13 = args->converter;
            err = local_50;
            pbVar17 = pbVar16;
            goto LAB_0030b865;
          }
        case 0xb:
        case 0xc:
          pbVar17 = pbVar16 + 1;
          *(undefined1 *)((long)pvVar3 + 0x70) = 0;
          if (*(char *)((long)pvVar3 + 0x60) != '\0') {
            if (pbVar17 < sourceLimit) goto LAB_0030ba40;
            args->converter->toUBytes[0] = bVar2;
            args->converter->toULength = '\x01';
            goto LAB_0030b9c1;
          }
          uVar7 = 0xffff;
          if (-1 < (char)bVar2) {
            uVar7 = uVar9;
          }
LAB_0030bb64:
          uVar9 = uVar7;
          pbVar17 = pbVar16 + 1;
          goto LAB_0030bb67;
        }
      } while( true );
    }
    goto LAB_0030b9c1;
  }
LAB_0030b90c:
  args->target = pUVar14;
  args->source = (char *)local_58;
  *(undefined1 *)((long)pvVar3 + 0x70) = 0;
  return;
LAB_0030ba40:
  bVar2 = *pbVar17;
  uVar9 = (uint)bVar2;
  local_40 = (ulong)bVar2;
  if (((uVar15 + 0xdf & 0xfe) < 0x5e) && ((byte)(bVar2 - 0x21) < 0x5e)) {
    pbVar17 = pbVar17 + 1;
    local_43 = *(char *)((long)pvVar3 + (long)*(char *)((long)pvVar3 + 0x60) + 0x5c);
    if ((long)local_43 < 0x20) {
      sharedData = *(UConverterSharedData **)((long)pvVar3 + (long)local_43 * 8);
      length = 2;
      local_43 = (char)uVar15;
    }
    else {
      sharedData = *(UConverterSharedData **)((long)pvVar3 + 0x18);
      local_43 = local_43 + '`';
      length = 3;
      uVar9 = uVar15;
      local_41 = bVar2;
    }
    local_42 = (undefined1)uVar9;
    local_58 = pbVar17;
    uVar9 = ucnv_MBCSSimpleGetNextUChar_63(sharedData,&local_43,length,'\0');
    uVar15 = uVar15 * 0x100 + (int)local_40;
  }
  else {
    uVar9 = 0xffff;
    if ((0x5d < (byte)(bVar2 - 0x21)) &&
       ((0x1f < bVar2 || ((0x800c000U >> (bVar2 & 0x1f) & 1) == 0)))) {
      pbVar17 = pbVar17 + 1;
      uVar15 = uVar15 * 0x100 + (uint)bVar2 + 0x10000;
    }
  }
  if ('\x01' < *(char *)((long)pvVar3 + 0x60)) {
    *(undefined1 *)((long)pvVar3 + 0x60) = *(undefined1 *)((long)pvVar3 + 0x61);
  }
LAB_0030bb67:
  UVar8 = (UChar)uVar9;
  local_58 = pbVar17;
  if (uVar9 < 0xfffe) {
    if (args->offsets != (int32_t *)0x0) {
      iVar12 = -1;
      if (0xff < uVar15) {
        iVar12 = -2;
      }
      *(int *)((long)args->offsets + ((long)pUVar14 - (long)args->target) * 2) =
           (iVar12 + (int)pbVar17) - *(int *)&args->source;
    }
    *pUVar14 = UVar8;
    pUVar14 = pUVar14 + 1;
    goto LAB_0030b944;
  }
  if (uVar9 < 0x10000) {
    pUVar13 = args->converter;
    iVar11 = '\x01';
    if (0xff < uVar15) {
      pUVar13->toUBytes[1] = (uint8_t)uVar15;
      uVar15 = uVar15 >> 8;
      iVar11 = '\x02';
    }
    pUVar13->toUBytes[0] = (uint8_t)uVar15;
    pUVar13->toULength = iVar11;
    *local_50 = (uint)(uVar9 != 0xfffe) * 2 + U_INVALID_CHAR_FOUND;
LAB_0030b9c1:
    args->target = pUVar14;
    args->source = (char *)pbVar17;
    return;
  }
  *pUVar14 = (short)(uVar9 + 0x3ff0000 >> 10) + L'\xd800';
  piVar5 = args->offsets;
  if (piVar5 == (int32_t *)0x0) {
    if (pUVar14 + 1 < args->targetLimit) {
      pUVar14[1] = UVar8 & 0x3ffU | 0xdc00;
      goto LAB_0030bc35;
    }
  }
  else {
    iVar12 = -1;
    if (0xff < uVar15) {
      iVar12 = -2;
    }
    iVar12 = (iVar12 + (int)pbVar17) - *(int *)&args->source;
    pUVar6 = args->target;
    *(int *)((long)piVar5 + ((long)pUVar14 - (long)pUVar6) * 2) = iVar12;
    pUVar4 = pUVar14 + 1;
    if (pUVar4 < args->targetLimit) {
      *pUVar4 = UVar8 & 0x3ffU | 0xdc00;
      *(int *)((long)piVar5 + ((long)pUVar4 - (long)pUVar6) * 2) = iVar12;
LAB_0030bc35:
      pUVar14 = pUVar14 + 2;
      goto LAB_0030b944;
    }
  }
  pUVar14 = pUVar14 + 1;
  pUVar13 = args->converter;
  cVar1 = pUVar13->UCharErrorBufferLength;
  pUVar13->UCharErrorBufferLength = cVar1 + '\x01';
  pUVar13->UCharErrorBuffer[cVar1] = UVar8 & 0x3ffU | 0xdc00;
  goto LAB_0030b944;
switchD_0030b981_caseD_a:
  pbVar17 = pbVar16 + 1;
  *(undefined2 *)(local_38 + 1) = 0;
  *local_38 = 0;
  *(undefined1 *)((long)pvVar3 + 0x70) = 0;
  goto LAB_0030bb67;
}

Assistant:

static void U_CALLCONV
UConverter_toUnicode_ISO_2022_CN_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,
                                               UErrorCode* err){
    char tempBuf[3];
    const char *mySource = (char *) args->source;
    UChar *myTarget = args->target;
    const char *mySourceLimit = args->sourceLimit;
    uint32_t targetUniChar = 0x0000;
    uint32_t mySourceChar = 0x0000;
    UConverterDataISO2022* myData;
    ISO2022State *pToU2022State;

    myData=(UConverterDataISO2022*)(args->converter->extraInfo);
    pToU2022State = &myData->toU2022State;

    if(myData->key != 0) {
        /* continue with a partial escape sequence */
        goto escape;
    } else if(args->converter->toULength == 1 && mySource < mySourceLimit && myTarget < args->targetLimit) {
        /* continue with a partial double-byte character */
        mySourceChar = args->converter->toUBytes[0];
        args->converter->toULength = 0;
        targetUniChar = missingCharMarker;
        goto getTrailByte;
    }

    while(mySource < mySourceLimit){

        targetUniChar =missingCharMarker;

        if(myTarget < args->targetLimit){

            mySourceChar= (unsigned char) *mySource++;

            switch(mySourceChar){
            case UCNV_SI:
                pToU2022State->g=0;
                if (myData->isEmptySegment) {
                    myData->isEmptySegment = FALSE;	/* we are handling it, reset to avoid future spurious errors */
                    *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                    args->converter->toUCallbackReason = UCNV_IRREGULAR;
                    args->converter->toUBytes[0] = static_cast<uint8_t>(mySourceChar);
                    args->converter->toULength = 1;
                    args->target = myTarget;
                    args->source = mySource;
                    return;
                }
                continue;

            case UCNV_SO:
                if(pToU2022State->cs[1] != 0) {
                    pToU2022State->g=1;
                    myData->isEmptySegment = TRUE;	/* Begin a new segment, empty so far */
                    continue;
                } else {
                    /* illegal to have SO before a matching designator */
                    myData->isEmptySegment = FALSE;	/* Handling a different error, reset this to avoid future spurious errs */
                    break;
                }

            case ESC_2022:
                mySource--;
escape:
                {
                    const char * mySourceBefore = mySource;
                    int8_t toULengthBefore = args->converter->toULength;

                    changeState_2022(args->converter,&(mySource),
                        mySourceLimit, ISO_2022_CN,err);

                    /* After SO there must be at least one character before a designator (designator error handled separately) */
                    if(myData->key==0 && U_SUCCESS(*err) && myData->isEmptySegment) {
                        *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                        args->converter->toUCallbackReason = UCNV_IRREGULAR;
                        args->converter->toULength = (int8_t)(toULengthBefore + (mySource - mySourceBefore));
                    }
                }

                /* invalid or illegal escape sequence */
                if(U_FAILURE(*err)){
                    args->target = myTarget;
                    args->source = mySource;
                    myData->isEmptySegment = FALSE;	/* Reset to avoid future spurious errors */
                    return;
                }
                continue;

            /* ISO-2022-CN does not use single-byte (C1) SS2 and SS3 */

            case CR:
            case LF:
                uprv_memset(pToU2022State, 0, sizeof(ISO2022State));
                U_FALLTHROUGH;
            default:
                /* convert one or two bytes */
                myData->isEmptySegment = FALSE;
                if(pToU2022State->g != 0) {
                    if(mySource < mySourceLimit) {
                        UConverterSharedData *cnv;
                        StateEnum tempState;
                        int32_t tempBufLen;
                        int leadIsOk, trailIsOk;
                        uint8_t trailByte;
getTrailByte:
                        trailByte = (uint8_t)*mySource;
                        /*
                         * Ticket 5691: consistent illegal sequences:
                         * - We include at least the first byte in the illegal sequence.
                         * - If any of the non-initial bytes could be the start of a character,
                         *   we stop the illegal sequence before the first one of those.
                         *
                         * In ISO-2022 DBCS, if the second byte is in the 21..7e range or is
                         * an ESC/SO/SI, we report only the first byte as the illegal sequence.
                         * Otherwise we convert or report the pair of bytes.
                         */
                        leadIsOk = (uint8_t)(mySourceChar - 0x21) <= (0x7e - 0x21);
                        trailIsOk = (uint8_t)(trailByte - 0x21) <= (0x7e - 0x21);
                        if (leadIsOk && trailIsOk) {
                            ++mySource;
                            tempState = (StateEnum)pToU2022State->cs[pToU2022State->g];
                            if(tempState >= CNS_11643_0) {
                                cnv = myData->myConverterArray[CNS_11643];
                                tempBuf[0] = (char) (0x80+(tempState-CNS_11643_0));
                                tempBuf[1] = (char) (mySourceChar);
                                tempBuf[2] = (char) trailByte;
                                tempBufLen = 3;

                            }else{
                                U_ASSERT(tempState<UCNV_2022_MAX_CONVERTERS);
                                cnv = myData->myConverterArray[tempState];
                                tempBuf[0] = (char) (mySourceChar);
                                tempBuf[1] = (char) trailByte;
                                tempBufLen = 2;
                            }
                            targetUniChar = ucnv_MBCSSimpleGetNextUChar(cnv, tempBuf, tempBufLen, FALSE);
                            mySourceChar = (mySourceChar << 8) | trailByte;
                        } else if (!(trailIsOk || IS_2022_CONTROL(trailByte))) {
                            /* report a pair of illegal bytes if the second byte is not a DBCS starter */
                            ++mySource;
                            /* add another bit so that the code below writes 2 bytes in case of error */
                            mySourceChar = 0x10000 | (mySourceChar << 8) | trailByte;
                        }
                        if(pToU2022State->g>=2) {
                            /* return from a single-shift state to the previous one */
                            pToU2022State->g=pToU2022State->prevG;
                        }
                    } else {
                        args->converter->toUBytes[0] = (uint8_t)mySourceChar;
                        args->converter->toULength = 1;
                        goto endloop;
                    }
                }
                else{
                    if(mySourceChar <= 0x7f) {
                        targetUniChar = (UChar) mySourceChar;
                    }
                }
                break;
            }
            if(targetUniChar < (missingCharMarker-1/*0xfffe*/)){
                if(args->offsets){
                    args->offsets[myTarget - args->target] = (int32_t)(mySource - args->source - (mySourceChar <= 0xff ? 1 : 2));
                }
                *(myTarget++)=(UChar)targetUniChar;
            }
            else if(targetUniChar > missingCharMarker){
                /* disassemble the surrogate pair and write to output*/
                targetUniChar-=0x0010000;
                *myTarget = (UChar)(0xd800+(UChar)(targetUniChar>>10));
                if(args->offsets){
                    args->offsets[myTarget - args->target] = (int32_t)(mySource - args->source - (mySourceChar <= 0xff ? 1 : 2));
                }
                ++myTarget;
                if(myTarget< args->targetLimit){
                    *myTarget = (UChar)(0xdc00+(UChar)(targetUniChar&0x3ff));
                    if(args->offsets){
                        args->offsets[myTarget - args->target] = (int32_t)(mySource - args->source - (mySourceChar <= 0xff ? 1 : 2));
                    }
                    ++myTarget;
                }else{
                    args->converter->UCharErrorBuffer[args->converter->UCharErrorBufferLength++]=
                                    (UChar)(0xdc00+(UChar)(targetUniChar&0x3ff));
                }

            }
            else{
                /* Call the callback function*/
                toUnicodeCallback(args->converter,mySourceChar,targetUniChar,err);
                break;
            }
        }
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }
endloop:
    args->target = myTarget;
    args->source = mySource;
}